

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O1

void Prs_NtkAddBox(Prs_Ntk_t *p,int ModName,int InstName,Vec_Int_t *vTemp)

{
  Vec_Int_t *p_00;
  uint Entry;
  long lVar1;
  
  if ((vTemp->nSize & 1) != 0) {
    __assert_fail("Vec_IntSize(vTemp) % 2 == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaPrs.h"
                  ,0x10d,"void Prs_NtkAddBox(Prs_Ntk_t *, int, int, Vec_Int_t *)");
  }
  p_00 = &p->vBoxes;
  if (((p->vBoxes).nSize & 1) == 0) {
    Vec_IntPush(p_00,-1);
  }
  Entry = (p->vBoxes).nSize;
  if ((Entry & 1) != 0) {
    Vec_IntPush(&p->vObjs,Entry);
    Vec_IntPush(p_00,vTemp->nSize + 2);
    Vec_IntPush(p_00,ModName);
    Vec_IntPush(p_00,InstName);
    if (0 < vTemp->nSize) {
      lVar1 = 0;
      do {
        Vec_IntPush(p_00,vTemp->pArray[lVar1]);
        lVar1 = lVar1 + 1;
      } while (lVar1 < vTemp->nSize);
    }
    return;
  }
  __assert_fail("Value & 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/cba/cbaPrs.h"
                ,0x111,"void Prs_NtkAddBox(Prs_Ntk_t *, int, int, Vec_Int_t *)");
}

Assistant:

static inline void Prs_NtkAddBox( Prs_Ntk_t * p, int ModName, int InstName, Vec_Int_t * vTemp )
{
    int Value;
    assert( Vec_IntSize(vTemp) % 2 == 0 );
    if ( !(Vec_IntSize(&p->vBoxes) & 1) )
        Vec_IntPush(&p->vBoxes, -1);
    Value = Vec_IntSize(&p->vBoxes);
    assert( Value & 1 );
    Vec_IntPush( &p->vObjs, Value );
    // create entry
    Vec_IntPush( &p->vBoxes, Vec_IntSize(vTemp)+2 );
    Vec_IntPush( &p->vBoxes, ModName );
    Vec_IntPush( &p->vBoxes, InstName );
    Vec_IntAppend( &p->vBoxes, vTemp );
}